

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
::List_column(List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *this,List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                    *column)

{
  Dimension DVar1;
  ID_index IVar2;
  Index IVar3;
  Field_operators *pFVar4;
  Entry_constructor *pEVar5;
  
  DVar1 = (column->super_Column_dimension_option).dim_;
  (column->super_Column_dimension_option).dim_ = -1;
  (this->super_Column_dimension_option).dim_ = DVar1;
  IVar2 = (column->super_Chain_column_option).pivot_;
  (column->super_Chain_column_option).pivot_ = 0xffffffff;
  (this->super_Chain_column_option).pivot_ = IVar2;
  IVar3 = (column->super_Chain_column_option).pairedColumn_;
  (column->super_Chain_column_option).pairedColumn_ = 0xffffffff;
  (this->super_Chain_column_option).pairedColumn_ = IVar3;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->column_,(_List_node_header *)&column->column_);
  pFVar4 = column->operators_;
  column->operators_ = (Field_operators *)0x0;
  this->operators_ = pFVar4;
  pEVar5 = column->entryPool_;
  column->entryPool_ = (Entry_constructor *)0x0;
  this->entryPool_ = pEVar5;
  return;
}

Assistant:

inline List_column<Master_matrix>::List_column(List_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      column_(std::move(column.column_)),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr))
{}